

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

size_t UA_readNumber(UA_Byte *buf,size_t buflen,UA_UInt32 *number)

{
  long lVar1;
  UA_UInt32 UVar2;
  size_t sVar3;
  size_t sVar4;
  UA_UInt32 UVar5;
  
  if (buf == (UA_Byte *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar3 = 0xffffffffffffffff;
    UVar2 = 0;
    do {
      UVar5 = UVar2;
      sVar4 = buflen;
      if (sVar3 - buflen == -1) break;
      lVar1 = sVar3 + 1;
      sVar4 = sVar3 + 1;
      sVar3 = sVar4;
      UVar2 = ((uint)buf[lVar1] + UVar5 * 10) - 0x30;
    } while (0xf5 < (byte)(buf[lVar1] - 0x3a));
    *number = UVar5;
  }
  return sVar4;
}

Assistant:

size_t UA_readNumber(UA_Byte *buf, size_t buflen, UA_UInt32 *number) {
    if (!buf)
        return 0;
    UA_UInt32 n = 0;
    size_t progress = 0;
    /* read numbers until the end or a non-number character appears */
    while(progress < buflen) {
        UA_Byte c = buf[progress];
        if('0' > c || '9' < c)
            break;
        n = (n*10) + (UA_UInt32)(c-'0');
        ++progress;
    }
    *number = n;
    return progress;
}